

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  FocusWindow(window);
  SetActiveID(window->MoveId,window);
  pIVar2->NavDisableHighlight = true;
  IVar1.y = (pIVar2->IO).MousePos.y - (window->RootWindow->Pos).y;
  IVar1.x = (pIVar2->IO).MousePos.x - (window->RootWindow->Pos).x;
  pIVar2->ActiveIdClickOffset = IVar1;
  if (((window->Flags & 4) == 0) && ((window->RootWindow->Flags & 4) == 0)) {
    pIVar2->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MousePos - window->RootWindow->Pos;

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}